

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_59db9::TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat::
~TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat
          (TestXmlTestReporterFixtureSingleSuccessfulTestReportSummaryFormat *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleSuccessfulTestReportSummaryFormat)
{
    TestDetails const details("TestName", "DefaultSuite", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportSummary(1, 0, 0, 0.1f);

    const char *expected =
"<?xml version=\"1.0\"?>"
"<unittest-results tests=\"1\" failedtests=\"0\" failures=\"0\" time=\"0.1\">"
"<test suite=\"DefaultSuite\" name=\"TestName\" time=\"0\"/>"
"</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}